

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ExpressionLhs<const_xll::expected<int,_int>_&>::endExpression
          (ExpressionLhs<const_xll::expected<int,_int>_&> *this)

{
  ResultBuilder *this_00;
  size_t sVar1;
  OfType OVar2;
  char *pcVar3;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = this->m_rb;
  sVar1 = (this->m_lhs->_value)._storage._which;
  pcVar3 = "false";
  if (sVar1 == 1) {
    pcVar3 = "true";
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,pcVar3,pcVar3 + ((ulong)(sVar1 == 1) ^ 5));
  std::__cxx11::string::_M_assign((string *)&(this_00->m_exprComponents).lhs);
  OVar2 = ExpressionFailed;
  if (sVar1 == 1) {
    OVar2 = Ok;
  }
  (this_00->m_data).resultType = OVar2;
  (this_00->m_exprComponents).testFalse =
       (bool)((byte)(char)(this_00->m_assertionInfo).resultDisposition >> 2 & 1);
  ResultBuilder::captureExpression(this_00);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }